

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::convertSwizzle
          (TGlslangToSpvTraverser *this,TIntermAggregate *node,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *swizzle)

{
  uint uVar1;
  iterator __position;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  undefined8 uStack_28;
  long lVar3;
  
  uStack_28 = in_RAX;
  iVar2 = (*(this->super_TIntermTraverser)._vptr_TIntermTraverser[0x33])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  lVar4 = *(long *)(lVar3 + 8);
  if (0 < (int)((ulong)(*(long *)(lVar3 + 0x10) - lVar4) >> 3)) {
    lVar5 = 0;
    do {
      lVar4 = (**(code **)(**(long **)(lVar4 + lVar5 * 8) + 0x28))();
      uVar1 = **(uint **)(*(long *)(lVar4 + 0xc0) + 8);
      uStack_28 = CONCAT44(uVar1,(undefined4)uStack_28);
      __position._M_current =
           (uint *)(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.loc.name;
      if (__position._M_current ==
          *(uint **)&(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.loc.string)
      {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)node,__position,
                   (uint *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = uVar1;
        (node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.loc.name =
             (TString *)(__position._M_current + 1);
      }
      lVar5 = lVar5 + 1;
      lVar4 = *(long *)(lVar3 + 8);
    } while (lVar5 < (int)((ulong)(*(long *)(lVar3 + 0x10) - lVar4) >> 3));
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::convertSwizzle(const glslang::TIntermAggregate& node, std::vector<unsigned>& swizzle)
{
    const glslang::TIntermSequence& swizzleSequence = node.getSequence();
    for (int i = 0; i < (int)swizzleSequence.size(); ++i)
        swizzle.push_back(swizzleSequence[i]->getAsConstantUnion()->getConstArray()[0].getIConst());
}